

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O1

void __thiscall xray_re::way_path_io::operator()(way_path_io *this,way_path *path,xr_writer *w)

{
  pointer pwVar1;
  pointer pwVar2;
  undefined8 in_RAX;
  xr_writer *pxVar3;
  pointer point;
  pointer link;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  xr_writer::w_raw_chunk(w,1,&WAYOBJECT_VERSION,2,false);
  xr_writer::open_chunk(w,2);
  uStack_28._0_6_ =
       CONCAT24((short)((uint)(*(int *)&(path->points).
                                        super__Vector_base<xray_re::way_point,_std::allocator<xray_re::way_point>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                              *(int *)&(path->points).
                                       super__Vector_base<xray_re::way_point,_std::allocator<xray_re::way_point>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x5555,
                (undefined4)uStack_28);
  pxVar3 = w;
  (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 4,2);
  pwVar1 = (path->points).
           super__Vector_base<xray_re::way_point,_std::allocator<xray_re::way_point>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (point = (path->points).
               super__Vector_base<xray_re::way_point,_std::allocator<xray_re::way_point>_>._M_impl.
               super__Vector_impl_data._M_start; point != pwVar1; point = point + 1) {
    way_point_io::operator()((way_point_io *)pxVar3,point,w);
  }
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,3);
  uStack_28 = CONCAT26((short)((uint)(*(int *)&(path->links).
                                               super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                     *(int *)&(path->links).
                                              super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3),
                       (undefined6)uStack_28);
  pxVar3 = w;
  (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 6,2);
  pwVar2 = (path->links).super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (link = (path->links).
              super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>._M_impl.
              super__Vector_impl_data._M_start; link != pwVar2; link = link + 1) {
    way_link_io::operator()((way_link_io *)pxVar3,link,w);
  }
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,5);
  xr_writer::w_sz(w,&path->name);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void way_path_io::operator()(const way_path* path, xr_writer& w) const
{
	w.w_chunk<uint16_t>(WAYOBJECT_CHUNK_VERSION, WAYOBJECT_VERSION);

	w.open_chunk(WAYOBJECT_CHUNK_POINTS);
	w.w_size_u16(path->points.size());
	w.w_seq(path->points, way_point_io());
	w.close_chunk();

	w.open_chunk(WAYOBJECT_CHUNK_LINKS);
	w.w_size_u16(path->links.size());
	w.w_seq(path->links, way_link_io());
	w.close_chunk();

	w.open_chunk(WAYOBJECT_CHUNK_NAME);
	w.w_sz(path->name);
	w.close_chunk();
}